

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patient.cpp
# Opt level: O0

Patient * __thiscall Patient::Gender_getter_abi_cxx11_(Patient *this)

{
  long in_RSI;
  Patient *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0xe0));
  return this;
}

Assistant:

string Patient :: Gender_getter(){
    return Gender;
}